

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall ON_SubD::DeleteComponents(ON_SubD *this,ON_COMPONENT_INDEX *ci_list,size_t ci_count)

{
  bool bVar1;
  uint uVar2;
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  ON_SimpleArray<ON_SubDComponentPtr> local_20;
  
  local_20._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00828990;
  local_20.m_a = (ON_SubDComponentPtr *)0x0;
  local_20.m_count = 0;
  local_20.m_capacity = 0;
  uVar2 = ComponentPtrFromComponentIndex(this,ci_list,ci_count,true,true,true,&local_20);
  if (uVar2 == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = DeleteComponentsForExperts
                      (this,local_20.m_a,local_20._16_8_ & 0xffffffff,true,true,false);
  }
  ON_SimpleArray<ON_SubDComponentPtr>::~ON_SimpleArray(&local_20);
  return bVar1;
}

Assistant:

bool ON_SubD::DeleteComponents(
  const ON_COMPONENT_INDEX* ci_list,
  size_t ci_count
  )
{
  ON_SimpleArray<ON_SubDComponentPtr> cptr_list;
  if (ComponentPtrFromComponentIndex(ci_list,ci_count,cptr_list) <= 0)
    return true; // nothing to delete

  return DeleteComponents(cptr_list.Array(),cptr_list.UnsignedCount(),false);
}